

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.hpp
# Opt level: O3

Reference * __thiscall
czh::node::Node::get<czh::value::Reference>
          (Reference *__return_storage_ptr__,Node *this,source_location *l)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Alloc_hider _Var2;
  variant_alternative_t<1UL,_variant<NodeData,_Value>_> *pvVar3;
  pointer __dest;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  undefined8 uVar7;
  size_type __dnew;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string local_b8;
  string local_98;
  Reference *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  assert_value(this,l);
  pvVar3 = std::get<1ul,czh::node::Node::NodeData,czh::value::Value>(&this->data);
  if (*(__index_type *)
       ((long)&(pvVar3->value).
               super__Variant_base<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               .
               super__Move_assign_alias<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>_>_>_>
               .
               super__Copy_assign_alias<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>_>_>_>
               .
               super__Move_ctor_alias<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>_>_>_>
               .
               super__Copy_ctor_alias<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>_>_>_>
               .
               super__Variant_storage_alias<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>_>_>_>
       + 0x20) == '\x06') goto LAB_001231f1;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_b8._M_dataplus._M_p = (char *)0x4a;
  local_78 = __return_storage_ptr__;
  __dest = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_create(&local_70,(size_type *)&local_b8,0);
  _Var2._M_p = local_b8._M_dataplus._M_p;
  local_70.field_2._M_allocated_capacity = (size_type)local_b8._M_dataplus._M_p;
  local_70._M_dataplus._M_p = __dest;
  memcpy(__dest,"std::string_view czh::value::details::nameof() [T = czh::value::Reference]",0x4a);
  local_70._M_string_length = (size_type)_Var2._M_p;
  __dest[_Var2._M_p] = '\0';
  pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                     (&local_70,0,0,"The value is not \'",0x12);
  local_50._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
  paVar5 = &pbVar4->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p == paVar5) {
    local_50.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
    local_50.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  }
  else {
    local_50.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
  }
  local_50._M_string_length = pbVar4->_M_string_length;
  (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
  pbVar4->_M_string_length = 0;
  (pbVar4->field_2)._M_local_buf[0] = '\0';
  pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_50,"\'.[Actual T = \'");
  paVar5 = &local_d8.field_2;
  local_d8._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
  paVar6 = &pbVar4->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p == paVar6) {
    local_d8.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
    local_d8.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
    local_d8._M_dataplus._M_p = (pointer)paVar5;
  }
  else {
    local_d8.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
  }
  local_d8._M_string_length = pbVar4->_M_string_length;
  (pbVar4->_M_dataplus)._M_p = (pointer)paVar6;
  pbVar4->_M_string_length = 0;
  (pbVar4->field_2)._M_local_buf[0] = '\0';
  value::details::get_typename_abi_cxx11_
            (&local_b8,
             (details *)
             (long)(char)*(__index_type *)
                          ((long)&(pvVar3->value).
                                  super__Variant_base<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                  .
                                  super__Move_assign_alias<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>_>_>_>
                                  .
                                  super__Copy_assign_alias<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>_>_>_>
                                  .
                                  super__Move_ctor_alias<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>_>_>_>
                                  .
                                  super__Copy_ctor_alias<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>_>_>_>
                                  .
                                  super__Variant_storage_alias<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>_>_>_>
                          + 0x20),local_d8._M_string_length);
  uVar7 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar5) {
    uVar7 = local_d8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar7 < local_b8._M_string_length + local_d8._M_string_length) {
    uVar7 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      uVar7 = local_b8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar7 < local_b8._M_string_length + local_d8._M_string_length) goto LAB_0012307c;
    pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_b8,0,0,local_d8._M_dataplus._M_p,local_d8._M_string_length);
  }
  else {
LAB_0012307c:
    pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_d8,local_b8._M_dataplus._M_p,local_b8._M_string_length);
  }
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar4->_M_dataplus)._M_p;
  paVar6 = &pbVar4->field_2;
  if (paVar1 == paVar6) {
    local_f8.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
    local_f8.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
  }
  else {
    local_f8.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
    local_f8._M_dataplus._M_p = (pointer)paVar1;
  }
  local_f8._M_string_length = pbVar4->_M_string_length;
  (pbVar4->_M_dataplus)._M_p = (pointer)paVar6;
  pbVar4->_M_string_length = 0;
  paVar6->_M_local_buf[0] = '\0';
  pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_f8,"\'].");
  local_98._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
  paVar6 = &pbVar4->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p == paVar6) {
    local_98.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
    local_98.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  }
  else {
    local_98.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
  }
  local_98._M_string_length = pbVar4->_M_string_length;
  (pbVar4->_M_dataplus)._M_p = (pointer)paVar6;
  pbVar4->_M_string_length = 0;
  (pbVar4->field_2)._M_local_buf[0] = '\0';
  report_error(&local_98,&this->czh_token,l);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  __return_storage_ptr__ = local_78;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar5) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,(ulong)(local_70.field_2._M_allocated_capacity + 1));
  }
LAB_001231f1:
  local_98._M_dataplus._M_p = (pointer)&PTR_s__workspace_llm4binary_github_lic_0019c728;
  value::Value::internal_get<czh::value::Reference>(__return_storage_ptr__,pvVar3);
  return __return_storage_ptr__;
}

Assistant:

T get(const std::source_location &l =
    std::source_location::current()) const
    {
      assert_value(l);
      auto &value = std::get<Value>(data);
      if (value.is<value::Reference>() && typeid(T) != typeid(value::Reference))
      {
        auto ptr = get_end_of_list_of_ref(value.get<value::Reference>(), l);
        assert_true(ptr != nullptr, "Can not get a circular reference.", czh_token, l);
        return ptr->get<T>();
      }
  
      if (!value.can_get<T>())
      {
        report_error("The value is not '" + std::string(value::details::nameof<T>()) + "'.[Actual T = '"
                     + value.get_typename() + "'].", czh_token, l);
      }
      return value.get<T>();
    }